

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,Extent v)

{
  undefined1 in_stack_00000150 [24];
  string local_30 [32];
  
  tinyusdz::to_string_abi_cxx11_((Extent)in_stack_00000150);
  std::operator<<(ofs,local_30);
  std::__cxx11::string::_M_dispose();
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Extent v) {
  ofs << to_string(v);

  return ofs;
}